

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

int Wlc_BlastReduction(Gia_Man_t *pNew,int *pFans,int nFans,int Type)

{
  uint iLit0;
  ulong uVar1;
  bool bVar2;
  
  bVar2 = Type == 0x28;
  if ((bVar2) || (Type == 0x25)) {
    if (nFans < 1) {
      iLit0 = 1;
    }
    else {
      iLit0 = 1;
      uVar1 = 0;
      do {
        iLit0 = Gia_ManHashAnd(pNew,iLit0,pFans[uVar1]);
        uVar1 = uVar1 + 1;
      } while ((uint)nFans != uVar1);
    }
  }
  else {
    bVar2 = Type == 0x29;
    if ((bVar2) || (Type == 0x26)) {
      if (0 < nFans) {
        uVar1 = 0;
        iLit0 = 0;
        do {
          iLit0 = Gia_ManHashOr(pNew,iLit0,pFans[uVar1]);
          uVar1 = uVar1 + 1;
        } while ((uint)nFans != uVar1);
        goto LAB_0030350e;
      }
    }
    else {
      bVar2 = Type == 0x2a;
      if ((!bVar2) && (Type != 0x27)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                      ,0xed,"int Wlc_BlastReduction(Gia_Man_t *, int *, int, int)");
      }
      if (0 < nFans) {
        uVar1 = 0;
        iLit0 = 0;
        do {
          iLit0 = Gia_ManHashXor(pNew,iLit0,pFans[uVar1]);
          uVar1 = uVar1 + 1;
        } while ((uint)nFans != uVar1);
        goto LAB_0030350e;
      }
    }
    iLit0 = 0;
  }
LAB_0030350e:
  if ((int)iLit0 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf5,"int Abc_LitNotCond(int, int)");
  }
  return bVar2 ^ iLit0;
}

Assistant:

int Wlc_BlastReduction( Gia_Man_t * pNew, int * pFans, int nFans, int Type )
{
    if ( Type == WLC_OBJ_REDUCT_AND || Type == WLC_OBJ_REDUCT_NAND )
    {
        int k, iLit = 1;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashAnd( pNew, iLit, pFans[k] );
        return Abc_LitNotCond( iLit, Type == WLC_OBJ_REDUCT_NAND );
    }
    if ( Type == WLC_OBJ_REDUCT_OR || Type == WLC_OBJ_REDUCT_NOR )
    {
        int k, iLit = 0;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashOr( pNew, iLit, pFans[k] );
        return Abc_LitNotCond( iLit, Type == WLC_OBJ_REDUCT_NOR );
    }
    if ( Type == WLC_OBJ_REDUCT_XOR || Type == WLC_OBJ_REDUCT_NXOR )
    {
        int k, iLit = 0;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashXor( pNew, iLit, pFans[k] );
        return Abc_LitNotCond( iLit, Type == WLC_OBJ_REDUCT_NXOR );
    }
    assert( 0 );
    return -1;
}